

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_GetMap_Test::~DescriptorTest_GetMap_Test
          (DescriptorTest_GetMap_Test *this)

{
  (this->super_DescriptorTest).super_Test._vptr_Test = (_func_int **)&PTR__DescriptorTest_018e01f0;
  DescriptorPool::~DescriptorPool(&(this->super_DescriptorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(DescriptorTest, GetMap) {
  const Descriptor* map_desc = map_->message_type();
  const FieldDescriptor* map_key = map_desc->map_key();
  ASSERT_TRUE(map_key != nullptr);
  EXPECT_EQ(map_key->name(), "key");
  EXPECT_EQ(map_key->number(), 1);

  const FieldDescriptor* map_value = map_desc->map_value();
  ASSERT_TRUE(map_value != nullptr);
  EXPECT_EQ(map_value->name(), "value");
  EXPECT_EQ(map_value->number(), 2);

  EXPECT_EQ(message_->map_key(), nullptr);
  EXPECT_EQ(message_->map_value(), nullptr);
}